

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

FontBakingOptions * dpfb::createFontBakingOptions(void)

{
  char *pcVar1;
  undefined *puVar2;
  int iVar3;
  runtime_error *prVar4;
  FontBakingOptions *in_RDI;
  allocator local_73;
  allocator local_72;
  undefined1 local_71;
  string local_70 [36];
  KerningSource local_4c;
  undefined1 local_45;
  KerningSource kerningSource;
  string local_38 [36];
  Hinting local_14;
  Hinting hinting;
  
  iVar3 = strcmp(args::hinting,"normal");
  if (iVar3 == 0) {
    local_14 = normal;
  }
  else {
    iVar3 = strcmp(args::hinting,"light");
    if (iVar3 != 0) {
      local_45 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_((char *)local_38,"Invalid hinting \"%s\"",args::hinting);
      std::runtime_error::runtime_error(prVar4,local_38);
      local_45 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_14 = light;
  }
  iVar3 = strcmp(args::kerning,"none");
  if (iVar3 == 0) {
    local_4c = none;
  }
  else {
    iVar3 = strcmp(args::kerning,"kern");
    if (iVar3 == 0) {
      local_4c = kern;
    }
    else {
      iVar3 = strcmp(args::kerning,"gpos");
      if (iVar3 == 0) {
        local_4c = gpos;
      }
      else {
        iVar3 = strcmp(args::kerning,"both");
        if (iVar3 != 0) {
          local_71 = 1;
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          str::format_abi_cxx11_((char *)local_70,"Invalid kerning \"%s\"",args::kerning);
          std::runtime_error::runtime_error(prVar4,local_70);
          local_71 = 0;
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_4c = kernAndGpos;
      }
    }
  }
  pcVar1 = args::fontPath;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_72);
  puVar2 = args::fontRenderer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&in_RDI->fontRenderer,puVar2,&local_73);
  in_RDI->fontIndex = args::fontIndex;
  iVar3 = ptToPx(args::fontSize,args::fontDpi);
  in_RDI->fontPxSize = iVar3;
  in_RDI->hinting = local_14;
  in_RDI->imageMaxSize = args::imageMaxSize;
  Edge::Edge(&in_RDI->imagePadding,args::imagePadding,DAT_001673f4,DAT_001673f8,DAT_001673fc);
  Edge::Edge(&in_RDI->glyphPaddingInner,args::glyphPaddingInner,DAT_00167484,DAT_00167488,
             DAT_0016748c);
  Edge::Edge(&in_RDI->glyphPaddingOuter,args::glyphPaddingOuter,DAT_00167494,DAT_00167498,
             DAT_0016749c);
  Point::Point(&in_RDI->glyphSpacing,args::glyphSpacing,DAT_001673c8);
  in_RDI->kerningSource = local_4c;
  std::allocator<char>::~allocator((allocator<char> *)&local_73);
  std::allocator<char>::~allocator((allocator<char> *)&local_72);
  return in_RDI;
}

Assistant:

static FontBakingOptions createFontBakingOptions()
{
    Hinting hinting;
    if (std::strcmp(args::hinting, "normal") == 0)
        hinting = Hinting::normal;
    else if (std::strcmp(args::hinting, "light") == 0)
        hinting = Hinting::light;
    else
        throw std::runtime_error(str::format(
            "Invalid hinting \"%s\"", args::hinting));

    KerningSource kerningSource;
    if (std::strcmp(args::kerning, "none") == 0)
        kerningSource = KerningSource::none;
    else if (std::strcmp(args::kerning, "kern") == 0)
        kerningSource = KerningSource::kern;
    else if (std::strcmp(args::kerning, "gpos") == 0)
        kerningSource = KerningSource::gpos;
    else if (std::strcmp(args::kerning, "both") == 0)
        kerningSource = KerningSource::kernAndGpos;
    else
        throw std::runtime_error(str::format(
            "Invalid kerning \"%s\"", args::kerning));

    return {
        args::fontPath,
        args::fontRenderer,
        args::fontIndex,
        ptToPx(args::fontSize, args::fontDpi),
        hinting,
        args::imageMaxSize,
        Edge(
            args::imagePadding[0],
            args::imagePadding[1],
            args::imagePadding[2],
            args::imagePadding[3]),
        Edge(
            args::glyphPaddingInner[0],
            args::glyphPaddingInner[1],
            args::glyphPaddingInner[2],
            args::glyphPaddingInner[3]),
        Edge(
            args::glyphPaddingOuter[0],
            args::glyphPaddingOuter[1],
            args::glyphPaddingOuter[2],
            args::glyphPaddingOuter[3]),
        Point(args::glyphSpacing[0], args::glyphSpacing[1]),
        kerningSource
    };
}